

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

value_type
pugi::impl::anon_unknown_0::utf32_decoder<pugi::impl::(anonymous_namespace)::opt_false>::
process<pugi::impl::(anonymous_namespace)::utf8_writer>(long data,long size,value_type result)

{
  uint ch;
  long lVar1;
  
  for (lVar1 = 0; size != lVar1; lVar1 = lVar1 + 1) {
    ch = *(uint *)(data + lVar1 * 4);
    if (ch < 0x10000) {
      result = utf8_writer::low(result,ch);
    }
    else {
      result = utf8_writer::high(result,ch);
    }
  }
  return result;
}

Assistant:

static inline typename Traits::value_type process(const uint32_t* data, size_t size, typename Traits::value_type result, Traits)
		{
			while (size)
			{
				uint32_t lead = opt_swap::value ? endian_swap(*data) : *data;

				// U+0000..U+FFFF
				if (lead < 0x10000)
				{
					result = Traits::low(result, lead);
					data += 1;
					size -= 1;
				}
				// U+10000..U+10FFFF
				else
				{
					result = Traits::high(result, lead);
					data += 1;
					size -= 1;
				}
			}

			return result;
		}